

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_headers_parser.h
# Opt level: O0

void __thiscall
cppcms::impl::cgi_headers_parser::consume<cppcms::impl::cgi::connection>
          (cgi_headers_parser *this,char **data,size_t *length,connection *conn)

{
  ulong uVar1;
  char *pcVar2;
  long *in_RCX;
  long *in_RDX;
  undefined8 *in_RSI;
  string *in_RDI;
  size_t size;
  cgi_headers_parser *in_stack_00000110;
  
  if (((byte)in_RDI[0x88] & 1) == 0) {
    while (*in_RDX != 0) {
      pcVar2 = (char *)*in_RSI;
      *in_RSI = pcVar2 + 1;
      std::__cxx11::string::operator+=(in_RDI,*pcVar2);
      *in_RDX = *in_RDX + -1;
      uVar1 = std::__cxx11::string::size();
      if (((1 < uVar1) &&
          (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI), *pcVar2 == '\r')) &&
         (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI), *pcVar2 == '\n')) {
        if (uVar1 == 2) {
          (**(code **)(*in_RCX + 0x18))(in_RCX,in_RDI + 0x20);
          in_RDI[0x88] = (string)0x1;
          return;
        }
        add_header(in_stack_00000110);
      }
    }
  }
  return;
}

Assistant:

void consume(char const *&data,size_t &length,Conn &conn)
	{
		if(completed_)
			return;
		while(length > 0) {
			header_ += *data++;
			length--;
			size_t size = header_.size();
			if(size >= 2 && header_[size-2] == '\r' && header_[size-1] == '\n') {
				if(size == 2) {
					conn.set_response_headers(h_);
					completed_ = true;
					return;
				}
				add_header();
			}
		}
	}